

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O3

void __thiscall EDLines::ValidateLineSegments(EDLines *this)

{
  pointer *ppLVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uchar *puVar6;
  bool bVar7;
  int *x;
  int *y;
  long lVar8;
  long lVar9;
  int k;
  ulong uVar10;
  int n;
  pointer pLVar11;
  LineSegment *__args;
  pointer pLVar12;
  iterator __position;
  long lVar13;
  long lVar14;
  uint uVar15;
  int j;
  long lVar16;
  byte bVar17;
  double dVar18;
  double dVar19;
  
  bVar17 = 0;
  lVar9 = (long)(this->super_ED).height + (long)(this->super_ED).width;
  uVar10 = 0xffffffffffffffff;
  if (-1 < (int)lVar9) {
    uVar10 = lVar9 * 0x10;
  }
  x = (int *)operator_new__(uVar10);
  y = (int *)operator_new__(uVar10);
  if (this->linesNo < 1) {
    uVar15 = 0;
  }
  else {
    uVar10 = 0;
    uVar15 = 0;
    do {
      pLVar11 = (this->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
                super__Vector_impl_data._M_start;
      dVar19 = pLVar11[uVar10].b;
      if (pLVar11[uVar10].invert != 0) {
        dVar19 = 1.0 / dVar19;
      }
      dVar19 = atan(dVar19);
      iVar2 = pLVar11[uVar10].len;
      if ((long)iVar2 < 0x50) {
        if (0x19 < iVar2) {
          lVar9 = *(long *)&(this->super_ED).segmentPoints.
                            super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[pLVar11[uVar10].segmentNo].
                            super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                            _M_impl.super__Vector_impl_data;
          lVar16 = 0;
          k = 0;
          n = 0;
          do {
            iVar3 = *(int *)(lVar9 + lVar16 * 8);
            if ((((0 < iVar3) && (iVar3 < (this->super_ED).height + -1)) &&
                (iVar4 = *(int *)(lVar9 + 4 + lVar16 * 8), 0 < iVar4)) &&
               (iVar5 = (this->super_ED).width, iVar4 < iVar5 + -1)) {
              n = n + 1;
              puVar6 = (this->super_ED).srcImg;
              lVar13 = (long)((iVar3 + 1) * iVar5 + iVar4);
              lVar14 = (long)((iVar3 + -1) * iVar5 + iVar4);
              lVar8 = (long)(iVar5 * iVar3 + iVar4);
              dVar18 = NFALUT::myAtan2((double)(int)(((uint)puVar6[lVar8 + 1] +
                                                      ((uint)puVar6[lVar14 + 1] -
                                                      (uint)puVar6[lVar13 + -1]) +
                                                     ((uint)puVar6[lVar13 + 1] -
                                                     (uint)puVar6[lVar14 + -1])) -
                                                    (uint)puVar6[lVar8 + -1]),
                                       (double)(int)((((uint)puVar6[lVar14 + 1] -
                                                      (uint)puVar6[lVar13 + -1]) -
                                                     ((uint)puVar6[lVar13] +
                                                     ((uint)puVar6[lVar13 + 1] -
                                                     (uint)puVar6[lVar14 + -1]))) +
                                                    (uint)puVar6[lVar14]));
              dVar18 = ABS((double)(~-(ulong)(dVar19 < 0.0) & (ulong)dVar19 |
                                   (ulong)(dVar19 + 3.141592653589793) & -(ulong)(dVar19 < 0.0)) -
                           dVar18);
              k = k + (uint)(dVar18 <= this->prec || 3.141592653589793 - this->prec <= dVar18);
            }
            lVar16 = lVar16 + 1;
          } while (iVar2 != lVar16);
          bVar7 = NFALUT::checkValidationByNFA(this->nfa,n,k);
          if (bVar7) goto LAB_00117408;
        }
        bVar7 = ValidateLineSegmentRect(this,x,y,pLVar11 + uVar10);
        if (bVar7) goto LAB_00117408;
        __args = (this->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl
                 .super__Vector_impl_data._M_start + uVar10;
        __position._M_current =
             (this->invalidLines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->invalidLines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<LineSegment,std::allocator<LineSegment>>::
          _M_realloc_insert<LineSegment_const&>
                    ((vector<LineSegment,std::allocator<LineSegment>> *)&this->invalidLines,
                     __position,__args);
        }
        else {
          for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
            (__position._M_current)->a = __args->a;
            __args = (LineSegment *)((long)__args + (ulong)bVar17 * -0x10 + 8);
            __position._M_current = __position._M_current + (ulong)bVar17 * -0x10 + 8;
          }
          ppLVar1 = &(this->invalidLines).
                     super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppLVar1 = *ppLVar1 + 1;
        }
      }
      else {
LAB_00117408:
        if (uVar10 != uVar15) {
          pLVar12 = (this->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pLVar11 = pLVar12 + uVar10;
          pLVar12 = pLVar12 + (int)uVar15;
          pLVar12->len = pLVar11->len;
          for (lVar9 = 8; lVar9 != 0; lVar9 = lVar9 + -1) {
            pLVar12->a = pLVar11->a;
            pLVar11 = (pointer)((long)pLVar11 + ((ulong)bVar17 * -2 + 1) * 8);
            pLVar12 = (pointer)((long)pLVar12 + ((ulong)bVar17 * -2 + 1) * 8);
          }
        }
        uVar15 = uVar15 + 1;
      }
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)this->linesNo);
  }
  this->linesNo = uVar15;
  operator_delete(x);
  operator_delete(y);
  return;
}

Assistant:

void EDLines::ValidateLineSegments()
{

	int *x = new int[(width + height) * 4];
	int *y = new int[(width + height) * 4];

	int noValidLines = 0;
	int eraseOffset = 0;
	for (int i = 0; i< linesNo; i++) {
		LineSegment *ls = &lines[i];

		// Compute Line's angle
		double lineAngle;

		if (ls->invert == 0) {
			// y = a + bx
			lineAngle = atan(ls->b);

		}
		else {
			// x = a + by
			lineAngle = atan(1.0 / ls->b);
		} //end-else

		if (lineAngle < 0) lineAngle += M_PI;

		Point *pixels = &(segmentPoints[ls->segmentNo][0]);
		int noPixels = ls->len;

		bool valid = false;

		// Accept very long lines without testing. They are almost never invalidated.
		if (ls->len >= 80) {
			valid = true;

			// Validate short line segments by a line support region rectangle having width=2
		}
		else if (ls->len <= 25) {
			valid = ValidateLineSegmentRect( x, y, ls);

		}
		else {
			// Longer line segments are first validated by a line support region rectangle having width=1 (for speed)
			// If the line segment is still invalid, then a line support region rectangle having width=2 is tried
			// If the line segment fails both tests, it is discarded
			int aligned = 0;
			int count = 0;
			for (int j = 0; j<noPixels; j++) {
				int r = pixels[j].x;
				int c = pixels[j].y;

				if (r <= 0 || r >= height - 1 || c <= 0 || c >= width - 1) continue;

				count++;

				// compute gx & gy using the simple [-1 -1 -1]
				//                                  [ 1  1  1]  filter in both directions
				// Faster method below
				// A B C
				// D x E
				// F G H
				// gx = (C-A) + (E-D) + (H-F)
				// gy = (F-A) + (G-B) + (H-C)
				//
				// To make this faster: 
				// com1 = (H-A)
				// com2 = (C-F)
				// Then: gx = com1 + com2 + (E-D) = (H-A) + (C-F) + (E-D) = (C-A) + (E-D) + (H-F)
				//       gy = com2 - com1 + (G-B) = (H-A) - (C-F) + (G-B) = (F-A) + (G-B) + (H-C)
				// 
				int com1 = srcImg[(r + 1)*width + c + 1] - srcImg[(r - 1)*width + c - 1];
				int com2 = srcImg[(r - 1)*width + c + 1] - srcImg[(r + 1)*width + c - 1];

				int gx = com1 + com2 + srcImg[r*width + c + 1] - srcImg[r*width + c - 1];
				int gy = com1 - com2 + srcImg[(r + 1)*width + c] - srcImg[(r - 1)*width + c];
				
				double pixelAngle = nfa->myAtan2((double)gx, (double)-gy);
				double diff = fabs(lineAngle - pixelAngle);

				if (diff <= prec || diff >= M_PI - prec) aligned++;
			} //end-for

			// Check validation by NFA computation (fast due to LUT)
			valid = nfa->checkValidationByNFA(count, aligned);
			if (valid == false) valid = ValidateLineSegmentRect(x, y, ls);
		} //end-else

		if (valid) {
			if (i != noValidLines) lines[noValidLines] = lines[i];
			noValidLines++;
		}
		else {
			invalidLines.push_back(lines[i]);
		} //end-else
	} //end-for

	linesNo = noValidLines;

	delete x;
	delete y;
}